

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O1

void __thiscall
cmOSXBundleGenerator::CreateAppBundle
          (cmOSXBundleGenerator *this,string *targetName,string *outpath,string *config)

{
  pointer pcVar1;
  size_type sVar2;
  string *targetName_00;
  bool bVar3;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string plist;
  string out;
  string local_110;
  string *local_f0;
  string *local_e8;
  string local_e0;
  string local_c0;
  undefined8 local_a0;
  undefined1 *puStack_98;
  undefined1 local_90 [32];
  basic_string_view<char,_std::char_traits<char>_> local_70;
  undefined8 local_60;
  undefined1 *puStack_58;
  size_type local_50;
  pointer local_48;
  undefined8 local_40;
  char *local_38;
  
  bVar3 = cmGeneratorTarget::HaveWellDefinedOutputFiles(this->GT);
  if (bVar3) {
    pcVar1 = (outpath->_M_dataplus)._M_p;
    sVar2 = outpath->_M_string_length;
    puStack_98 = local_90;
    local_a0 = 1;
    local_90[0] = 0x2f;
    local_f0 = targetName;
    local_e8 = config;
    cmGeneratorTarget::GetAppBundleDirectory(&local_110,this->GT,config,FullLevel);
    local_60 = local_a0;
    puStack_58 = puStack_98;
    local_50 = local_110._M_string_length;
    local_48 = local_110._M_dataplus._M_p;
    views._M_len = 3;
    views._M_array = &local_70;
    local_70._M_len = sVar2;
    local_70._M_str = pcVar1;
    cmCatViews_abi_cxx11_(&local_e0,views);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::MakeDirectory(&local_e0,(mode_t *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Makefile->OutputFiles,&local_e0);
    pcVar1 = (outpath->_M_dataplus)._M_p;
    sVar2 = outpath->_M_string_length;
    local_a0 = 1;
    puStack_98 = local_90;
    local_90[0] = 0x2f;
    cmGeneratorTarget::GetAppBundleDirectory(&local_c0,this->GT,local_e8,ContentLevel);
    local_60 = local_a0;
    puStack_58 = puStack_98;
    local_50 = local_c0._M_string_length;
    local_48 = local_c0._M_dataplus._M_p;
    local_40 = 0xb;
    local_38 = "/Info.plist";
    views_00._M_len = 4;
    views_00._M_array = &local_70;
    local_70._M_len = sVar2;
    local_70._M_str = pcVar1;
    cmCatViews_abi_cxx11_(&local_110,views_00);
    targetName_00 = local_f0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    cmLocalGenerator::GenerateAppleInfoPList(this->LocalGenerator,this->GT,targetName_00,&local_110)
    ;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Makefile->OutputFiles,&local_110);
    std::__cxx11::string::_M_assign((string *)outpath);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmOSXBundleGenerator::CreateAppBundle(const std::string& targetName,
                                           std::string& outpath,
                                           const std::string& config)
{
  if (this->MustSkip()) {
    return;
  }

  // Compute bundle directory names.
  std::string out = cmStrCat(
    outpath, '/',
    this->GT->GetAppBundleDirectory(config, cmGeneratorTarget::FullLevel));
  cmSystemTools::MakeDirectory(out);
  this->Makefile->AddCMakeOutputFile(out);

  // Configure the Info.plist file.  Note that it needs the executable name
  // to be set.
  std::string plist = cmStrCat(
    outpath, '/',
    this->GT->GetAppBundleDirectory(config, cmGeneratorTarget::ContentLevel),
    "/Info.plist");
  this->LocalGenerator->GenerateAppleInfoPList(this->GT, targetName, plist);
  this->Makefile->AddCMakeOutputFile(plist);
  outpath = out;
}